

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<capnp::RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>_>::
~ExceptionOr(ExceptionOr<capnp::RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>_>
             *this)

{
  ExceptionOr<capnp::RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>_>
  *this_local;
  
  Maybe<capnp::RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>_>::~Maybe
            (&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}